

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cx_string.hpp
# Opt level: O2

cx_string<12UL>
mserialize::cx_strcat<7ul,3ul,1ul,1ul>
          (cx_string<7UL> *strings,cx_string<3UL> *strings_1,cx_string<1UL> *strings_2,
          cx_string<1UL> *strings_3)

{
  char *pcVar1;
  long lVar2;
  ulong uVar3;
  cx_string<12UL> cVar4;
  char buffer [13];
  ulong auStack_78 [6];
  long lStack_48;
  cx_string<7UL> *local_40;
  cx_string<3UL> *local_38;
  cx_string<1UL> *local_30;
  cx_string<1UL> *local_28;
  undefined1 local_18 [16];
  
  pcVar1 = buffer;
  buffer[8] = '\0';
  buffer[9] = '\0';
  buffer[10] = '\0';
  buffer[0xb] = '\0';
  buffer[0xc] = '\0';
  buffer[0] = '\0';
  buffer[1] = '\0';
  buffer[2] = '\0';
  buffer[3] = '\0';
  buffer[4] = '\0';
  buffer[5] = '\0';
  buffer[6] = '\0';
  buffer[7] = '\0';
  local_40 = strings;
  local_38 = strings_1;
  local_30 = strings_2;
  local_28 = strings_3;
  auStack_78[1] = 7;
  auStack_78[2] = 3;
  auStack_78[3] = 1;
  auStack_78[4] = 1;
  for (lVar2 = 1; lVar2 != 5; lVar2 = lVar2 + 1) {
    for (uVar3 = 0; uVar3 < auStack_78[lVar2]; uVar3 = uVar3 + 1) {
      pcVar1[uVar3] = *(undefined1 *)((&lStack_48)[lVar2] + uVar3);
    }
    pcVar1 = pcVar1 + uVar3;
  }
  cx_string<12UL>::cx_string((cx_string<12UL> *)local_18,buffer);
  cVar4._data._8_5_ = (uint5)(uint)local_18._12_4_ << 0x20 | (uint5)(uint)local_18._8_4_;
  cVar4._data[0] = local_18[0];
  cVar4._data[1] = local_18[1];
  cVar4._data[2] = local_18[2];
  cVar4._data[3] = local_18[3];
  cVar4._data[4] = local_18[4];
  cVar4._data[5] = local_18[5];
  cVar4._data[6] = local_18[6];
  cVar4._data[7] = local_18[7];
  return (cx_string<12UL>)cVar4._data;
}

Assistant:

constexpr auto cx_strcat(const cx_string<N>&&... strings)
{
  char buffer[detail::sum<N...>()+1] = {0};
  const char* data[] = {"", strings.data()...};
  const std::size_t size[] = {0, strings.size()...};

  char* out = buffer;
  for (std::size_t i = 1; i <= sizeof...(N); ++i)
  {
    for (std::size_t s = 0; s < size[i]; ++s) { *out++ = data[i][s]; } // NOLINT
  }

  return cx_string<sizeof(buffer)-1>(buffer);
}